

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_fe.h
# Opt level: O3

size_type __thiscall
lf::fe::FeHierarchicTria<double>::NumEvaluationNodes(FeHierarchicTria<double> *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = 3;
  if (1 < (this->edge_degrees_)._M_elems[0]) {
    iVar2 = (int)((this->qr_dual_edge_)._M_elems[0]->points_).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols +
            3;
  }
  iVar3 = 0;
  iVar1 = 0;
  if (1 < (this->edge_degrees_)._M_elems[1]) {
    iVar1 = (int)((this->qr_dual_edge_)._M_elems[1]->points_).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
  }
  if (1 < (this->edge_degrees_)._M_elems[2]) {
    iVar3 = (int)((this->qr_dual_edge_)._M_elems[2]->points_).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
  }
  return iVar1 + iVar2 + iVar3 +
         (int)(this->qr_dual_tria_->points_).
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
}

Assistant:

[[nodiscard]] lf::base::size_type NumEvaluationNodes() const override {
    const auto Ns0 = edge_degrees_[0] > 1 ? qr_dual_edge_[0]->NumPoints() : 0;
    const auto Ns1 = edge_degrees_[1] > 1 ? qr_dual_edge_[1]->NumPoints() : 0;
    const auto Ns2 = edge_degrees_[2] > 1 ? qr_dual_edge_[2]->NumPoints() : 0;
    const lf::base::size_type Nt = qr_dual_tria_->NumPoints();
    return 3 + Ns0 + Ns1 + Ns2 + Nt;
  }